

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

Symbol * __thiscall
slang::ast::Lookup::selectChild
          (Lookup *this,Symbol *initialSymbol,
          span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors,
          ASTContext *context,LookupResult *result)

{
  SymbolKind SVar1;
  int iVar2;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this_00;
  SyntaxNode *this_01;
  BumpAllocator *args;
  SVInt *this_02;
  long lVar3;
  int iVar4;
  bool bVar5;
  logic_t lVar6;
  uint uVar7;
  optional<int> oVar8;
  _Storage<slang::ConstantRange,_true> _Var9;
  _Optional_payload_base<int> _Var10;
  ulong uVar11;
  Diagnostic *pDVar12;
  __extent_storage<18446744073709551615UL> this_03;
  DiagCode code;
  DiagCode code_00;
  SourceLocation noteLocation;
  _Storage<int,_true> _Var13;
  bitwidth_t *pbVar14;
  Symbol *pSVar15;
  int iVar16;
  _Storage<int,_true> _Var17;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this_04;
  SourceRange SVar18;
  optional<slang::ConstantRange> oVar19;
  int32_t translated;
  int32_t idx;
  ConstantRange newRange;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_c0;
  undefined8 local_b8;
  AssertionInstanceDetails **local_b0;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_a8;
  InstanceArraySymbol *local_a0;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *local_98;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *local_90;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  ConstantRange local_78;
  int local_6c;
  SVInt *local_68;
  SyntaxNode *local_60;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *local_58;
  pointer local_50;
  SourceLocation local_48;
  Token local_40;
  
  this_03 = selectors._M_extent._M_extent_value;
  if (selectors._M_ptr == (pointer)0x0) {
    return (Symbol *)this;
  }
  local_58 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)
             (&initialSymbol->kind + (long)selectors._M_ptr * 2);
  local_98 = (SmallVectorBase<slang::ast::HierarchicalReference::Element> *)&context[4].flags;
  local_b0 = &context[5].assertionInstance;
  this_04.val = 0;
  do {
    this_00 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
              *(anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)initialSymbol;
    SVar1 = (((InstanceArraySymbol *)this)->super_Symbol).kind;
    if ((SVar1 != InstanceArray) && (SVar1 != GenerateBlockArray)) {
      lVar3 = *(long *)this_03._M_extent_value;
      SVar18 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00.pVal);
      pDVar12 = Diagnostics::add((Diagnostics *)local_b0,*(Symbol **)(lVar3 + 8),(DiagCode)0x2e000a,
                                 SVar18);
      Diagnostic::operator<<(pDVar12,(((InstanceArraySymbol *)this)->super_Symbol).name);
      noteLocation = (((InstanceArraySymbol *)this)->super_Symbol).location;
LAB_002d75b7:
      Diagnostic::addNote(pDVar12,(DiagCode)0x50001,noteLocation);
      return (Symbol *)0x0;
    }
    this_01 = *(SyntaxNode **)(this_00.val + 0x28);
    if (this_01 == (SyntaxNode *)0x0) {
LAB_002d742d:
      lVar3 = *(long *)this_03._M_extent_value;
      SVar18 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00.pVal);
      pSVar15 = *(Symbol **)(lVar3 + 8);
      code.subsystem = Lookup;
      code.code = 0x15;
LAB_002d744d:
      Diagnostics::add((Diagnostics *)local_b0,pSVar15,code,SVar18);
      return (Symbol *)0x0;
    }
    if ((SyntaxNode *)this_04.val != (SyntaxNode *)0x0) {
      lVar3 = *(long *)this_03._M_extent_value;
      SVar18 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00.pVal);
      pDVar12 = Diagnostics::add((Diagnostics *)local_b0,*(Symbol **)(lVar3 + 8),(DiagCode)0x940007,
                                 SVar18);
      SVar18 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_04.pVal);
      Diagnostic::operator<<(pDVar12,SVar18);
      return (Symbol *)0x0;
    }
    local_90 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)initialSymbol;
    if (this_01->kind != BitSelect) {
      if (SVar1 == InstanceArray) {
        if ((SVInt *)(((InstanceArraySymbol *)this)->elements)._M_extent._M_extent_value ==
            (SVInt *)0x0) {
          return (Symbol *)0x0;
        }
        _Var9._M_value =
             (ConstantRange)
             ASTContext::evalInteger
                       ((ASTContext *)this_03._M_extent_value,*(ExpressionSyntax **)(this_01 + 1),
                        (bitmask<slang::ast::ASTFlags>)0x0);
        _Var10 = (_Optional_payload_base<int>)
                 ASTContext::evalInteger
                           ((ASTContext *)this_03._M_extent_value,
                            *(ExpressionSyntax **)(this_01 + 2),(bitmask<slang::ast::ASTFlags>)0x0);
        if (((ulong)_Var9 & 0x100000000) == 0) {
          return (Symbol *)0x0;
        }
        if (((ulong)_Var10 & 0x100000000) == 0) {
          return (Symbol *)0x0;
        }
        _Var13._M_value = _Var9._M_value.left;
        _Var17 = _Var10._M_payload;
        if (this_01->kind == SimpleRangeSelect) {
          if (_Var17._M_value <= _Var13._M_value !=
              (((InstanceArraySymbol *)this)->range).right <=
              (((InstanceArraySymbol *)this)->range).left) {
            iVar16 = _Var13._M_value - _Var17._M_value;
            if (_Var13._M_value - _Var17._M_value == 0 || _Var13._M_value < _Var17._M_value) {
              iVar16 = -(_Var13._M_value - _Var17._M_value);
            }
            if (iVar16 - 1U < 0xfffffffe) {
              lVar3 = *(long *)this_03._M_extent_value;
              SVar18 = slang::syntax::SyntaxNode::sourceRange(this_01);
              pSVar15 = *(Symbol **)(lVar3 + 8);
              code_00.subsystem = Lookup;
              code_00.code = 0x11;
              goto LAB_002d74bd;
            }
          }
        }
        else {
          if (_Var17._M_value < 1) {
            lVar3 = *(long *)this_03._M_extent_value;
            SVar18 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(this_01 + 2));
            pSVar15 = *(Symbol **)(lVar3 + 8);
            code.subsystem = Numeric;
            code.code = 8;
            goto LAB_002d744d;
          }
          oVar19 = ConstantRange::getIndexedRange
                             (_Var13._M_value,_Var17._M_value,
                              (((InstanceArraySymbol *)this)->range).right <=
                              (((InstanceArraySymbol *)this)->range).left,
                              this_01->kind == AscendingRangeSelect);
          _Var9 = oVar19.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_payload;
          if (((undefined1  [12])
               oVar19.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
              (undefined1  [12])0x0) {
            lVar3 = *(long *)this_03._M_extent_value;
            SVar18 = slang::syntax::SyntaxNode::sourceRange(this_01);
            pSVar15 = *(Symbol **)(lVar3 + 8);
            code.subsystem = Expressions;
            code.code = 0x8b;
            goto LAB_002d744d;
          }
          _Var10 = (_Optional_payload_base<int>)((ulong)_Var9 >> 0x20);
        }
        _Var17._M_value = _Var9._M_value.left;
        local_a8 = this_00;
        bVar5 = ConstantRange::containsPoint(&((InstanceArraySymbol *)this)->range,_Var17._M_value);
        if (bVar5) {
          _Var13 = _Var10._M_payload;
          bVar5 = ConstantRange::containsPoint
                            (&((InstanceArraySymbol *)this)->range,_Var13._M_value);
          if (bVar5) {
            iVar16 = (((InstanceArraySymbol *)this)->range).left;
            iVar2 = (((InstanceArraySymbol *)this)->range).right;
            if (iVar2 < iVar16) {
              iVar16 = iVar2;
            }
            iVar2 = _Var13._M_value - iVar16;
            iVar4 = _Var17._M_value - iVar16;
            if (_Var17._M_value - _Var13._M_value != 0 && _Var13._M_value <= _Var17._M_value) {
              iVar2 = _Var17._M_value - iVar16;
              iVar4 = _Var13._M_value - iVar16;
            }
            uVar11 = (long)(iVar2 - iVar4) + 1;
            local_b8 = (long)(((InstanceArraySymbol *)this)->elements)._M_extent._M_extent_value -
                       (long)iVar4;
            if (uVar11 != 0xffffffffffffffff) {
              local_b8 = uVar11;
            }
            local_c0.pVal = (uint64_t *)((((InstanceArraySymbol *)this)->elements)._M_ptr + iVar4);
            local_78.left = _Var17._M_value - (int)_Var13;
            if (_Var17._M_value - (int)_Var13 == 0 || _Var17._M_value < _Var13._M_value) {
              local_78.left = -(_Var17._M_value - _Var13._M_value);
            }
            local_78.right = 0;
            if (_Var17._M_value < _Var13._M_value) {
              local_78 = (ConstantRange)((ulong)(uint)local_78.left << 0x20);
            }
            args = (BumpAllocator *)**(undefined8 **)this_03._M_extent_value;
            local_88._M_len = 0;
            local_88._M_str = "";
            local_40 = slang::syntax::SyntaxNode::getFirstToken(this_01);
            local_48 = parsing::Token::location(&local_40);
            this = (Lookup *)
                   BumpAllocator::
                   emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,std::span<slang::ast::Symbol_const*const,18446744073709551615ul>&,slang::ConstantRange&>
                             (args,(Compilation *)args,&local_88,&local_48,
                              (span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                              &local_c0,&local_78);
            local_88._M_len = CONCAT44(iVar2,iVar4);
            SmallVectorBase<slang::ast::HierarchicalReference::Element>::
            emplace_back<slang::ast::InstanceArraySymbol&,std::pair<int,int>>
                      (local_98,(InstanceArraySymbol *)this,(pair<int,_int> *)&local_88);
            this_04 = local_a8;
            goto LAB_002d740e;
          }
        }
        lVar3 = *(long *)this_03._M_extent_value;
        SVar18 = slang::syntax::SyntaxNode::sourceRange(this_01);
        pSVar15 = *(Symbol **)(lVar3 + 8);
        code_00.subsystem = Lookup;
        code_00.code = 2;
LAB_002d74bd:
        pDVar12 = Diagnostics::add((Diagnostics *)local_b0,pSVar15,code_00,SVar18);
        local_c0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)_Var9._M_value.left;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&pDVar12->args,(long *)&local_c0.val);
        local_c0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)_Var10._M_payload._M_value;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&pDVar12->args,(long *)&local_c0.val);
        local_c0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                   (long)(((InstanceArraySymbol *)this)->range).left;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&pDVar12->args,(long *)&local_c0.val);
        local_c0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                   (long)(((InstanceArraySymbol *)this)->range).right;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&pDVar12->args,(long *)&local_c0.val);
        return (Symbol *)0x0;
      }
      goto LAB_002d742d;
    }
    oVar8 = ASTContext::evalInteger
                      ((ASTContext *)this_03._M_extent_value,*(ExpressionSyntax **)(this_01 + 1),
                       (bitmask<slang::ast::ASTFlags>)0x0);
    if (((ulong)oVar8.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> & 0x100000000) == 0) {
      return (Symbol *)0x0;
    }
    _Var17._M_value =
         oVar8.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
         _M_payload;
    if ((((InstanceArraySymbol *)this)->super_Symbol).kind == InstanceArray) {
      if ((SVInt *)(((InstanceArraySymbol *)this)->elements)._M_extent._M_extent_value ==
          (SVInt *)0x0) {
        return (Symbol *)0x0;
      }
      bVar5 = ConstantRange::containsPoint(&((InstanceArraySymbol *)this)->range,_Var17._M_value);
      if (!bVar5) {
        lVar3 = *(long *)this_03._M_extent_value;
        SVar18 = slang::syntax::SyntaxNode::sourceRange(this_01);
        pDVar12 = Diagnostics::add((Diagnostics *)local_b0,*(Symbol **)(lVar3 + 8),
                                   (DiagCode)0x2d000a,SVar18);
        local_c0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)_Var17._M_value;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&pDVar12->args,(long *)&local_c0.val);
        noteLocation = (((InstanceArraySymbol *)this)->super_Symbol).location;
        goto LAB_002d75b7;
      }
      iVar16 = (((InstanceArraySymbol *)this)->range).left;
      iVar2 = (((InstanceArraySymbol *)this)->range).right;
      if (iVar2 < iVar16) {
        iVar16 = iVar2;
      }
      local_c0.val._0_4_ = _Var17._M_value - iVar16;
      this = (Lookup *)(((InstanceArraySymbol *)this)->elements)._M_ptr[_Var17._M_value - iVar16];
      SmallVectorBase<slang::ast::HierarchicalReference::Element>::
      emplace_back<slang::ast::Symbol_const&,int&>(local_98,(Symbol *)this,(int *)&local_c0.val);
    }
    else {
      if ((char)(((InstanceArraySymbol *)this)->range).right != '\x01') {
        return (Symbol *)0x0;
      }
      local_88._M_len = local_88._M_len & 0xffffffff00000000;
      local_68 = (SVInt *)(((InstanceArraySymbol *)this)->elements)._M_extent._M_extent_value;
      local_a8 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)_Var17._M_value;
      local_a0 = (InstanceArraySymbol *)this;
      local_60 = this_01;
      if (local_68 != (SVInt *)0x0) {
        uVar11 = (ulong)(_Var17._M_value >> 0x1f ^ _Var17._M_value);
        if (uVar11 == 0) {
          uVar7 = 0x40;
        }
        else {
          lVar3 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          uVar7 = (uint)lVar3 ^ 0x3f;
        }
        local_50 = (((InstanceArraySymbol *)this)->elements)._M_ptr;
        local_6c = 0x41 - uVar7;
        local_68 = (SVInt *)((long)local_68 << 3);
        iVar16 = 1;
        pbVar14 = (bitwidth_t *)0x0;
        do {
          this = *(Lookup **)((long)local_50 + (long)pbVar14);
          this_02 = (SVInt *)(((InstanceArraySymbol *)this)->elements)._M_extent._M_extent_value;
          uVar11 = local_b8 >> 0x28;
          local_c0 = local_a8;
          local_b8 = CONCAT35((uint3)uVar11 & 0xffff00,0x100000000);
          local_b8 = CONCAT44(local_b8._4_4_,local_6c);
          SVInt::clearUnusedBits((SVInt *)&local_c0);
          lVar6 = SVInt::operator==(this_02,(SVInt *)&local_c0);
          if (((0x40 < (uint)local_b8) || ((local_b8 & 0x10000000000) != 0)) &&
             ((SyntaxNode *)local_c0.val != (SyntaxNode *)0x0)) {
            operator_delete__(local_c0.pVal);
          }
          if (lVar6.value != '\0' && (lVar6.value != 0x80 && lVar6.value != '@')) {
            SmallVectorBase<slang::ast::HierarchicalReference::Element>::
            emplace_back<slang::ast::GenerateBlockSymbol_const&,int&>
                      (local_98,(GenerateBlockSymbol *)this,(int *)&local_88);
            goto LAB_002d73f5;
          }
          local_88._M_len = CONCAT44(local_88._M_len._4_4_,iVar16);
          iVar16 = iVar16 + 1;
          pbVar14 = pbVar14 + 2;
        } while (local_68 != (SVInt *)pbVar14);
      }
      lVar3 = *(long *)this_03._M_extent_value;
      SVar18 = slang::syntax::SyntaxNode::sourceRange(local_60);
      pDVar12 = Diagnostics::add((Diagnostics *)local_b0,*(Symbol **)(lVar3 + 8),(DiagCode)0x2d000a,
                                 SVar18);
      local_c0 = local_a8;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<long>(&pDVar12->args,(long *)&local_c0.val);
      Diagnostic::addNote(pDVar12,(DiagCode)0x50001,(local_a0->super_Symbol).location);
      this = (Lookup *)0x0;
    }
LAB_002d73f5:
    this_04.val = 0;
    if ((InstanceArraySymbol *)this == (InstanceArraySymbol *)0x0) {
      return (Symbol *)0x0;
    }
LAB_002d740e:
    initialSymbol = (Symbol *)(local_90 + 1);
    if ((anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)initialSymbol == local_58) {
      return &((InstanceArraySymbol *)this)->super_Symbol;
    }
  } while( true );
}

Assistant:

const Symbol* Lookup::selectChild(const Symbol& initialSymbol,
                                  std::span<const ElementSelectSyntax* const> selectors,
                                  const ASTContext& context, LookupResult& result) {
    const Symbol* symbol = &initialSymbol;
    const SyntaxNode* prevRangeSelect = nullptr;
    for (const ElementSelectSyntax* syntax : selectors) {
        if (symbol->kind != SymbolKind::InstanceArray &&
            symbol->kind != SymbolKind::GenerateBlockArray) {
            // I think it's safe to assume that the symbol name here will not be empty
            // because if it was, it'd be an instance array or generate array.
            auto& diag = result.addDiag(*context.scope, diag::ScopeNotIndexable,
                                        syntax->sourceRange());
            diag << symbol->name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return nullptr;
        }

        auto selectorError = [&]() -> const Symbol* {
            result.addDiag(*context.scope, diag::InvalidScopeIndexExpression,
                           syntax->sourceRange());
            return nullptr;
        };

        if (!syntax->selector)
            return selectorError();

        if (prevRangeSelect) {
            result.addDiag(*context.scope, diag::SelectAfterRangeSelect, syntax->sourceRange())
                << prevRangeSelect->sourceRange();
            return nullptr;
        }

        switch (syntax->selector->kind) {
            case SyntaxKind::BitSelect:
                symbol = selectSingleChild(*symbol, syntax->selector->as<BitSelectSyntax>(),
                                           context, result);
                if (!symbol)
                    return nullptr;
                break;
            case SyntaxKind::SimpleRangeSelect:
            case SyntaxKind::AscendingRangeSelect:
            case SyntaxKind::DescendingRangeSelect:
                prevRangeSelect = syntax;
                if (symbol->kind != SymbolKind::InstanceArray)
                    return selectorError();

                symbol = selectChildRange(symbol->as<InstanceArraySymbol>(),
                                          syntax->selector->as<RangeSelectSyntax>(), context,
                                          result);
                if (!symbol)
                    return nullptr;
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    return symbol;
}